

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

bool __thiscall
duckdb::BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *this)

{
  bool bVar1;
  byte width;
  byte bVar2;
  bitpacking_width_t width_00;
  idx_t iVar3;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_01;
  uint64_t uVar4;
  uhugeint_t uVar5;
  uhugeint_t value;
  uhugeint_t value_00;
  uint64_t extraout_RDX_00;
  
  if (this->compression_buffer_idx == 0) {
    return true;
  }
  if (((this->all_invalid != false) ||
      (bVar1 = uhugeint_t::operator==(&this->maximum,&this->minimum), bVar1)) &&
     ((byte)(this->mode - AUTO) < 2)) {
    this->total_size = this->total_size + 0x14;
    return true;
  }
  CalculateFORStats(this);
  CalculateDeltaStats(this);
  uVar4 = extraout_RDX;
  if (this->can_do_delta == true) {
    bVar1 = hugeint_t::operator==(&this->maximum_delta,&this->minimum_delta);
    if ((bVar1) && ((this->mode & ~AUTO) != DELTA_FOR)) {
      this->total_size = this->total_size + 0x24;
      return true;
    }
    uVar5 = hugeint_t::operator_cast_to_uhugeint_t(&this->min_max_delta_diff);
    value.upper = uVar5.upper;
    value.lower = value.upper;
    width = BitpackingPrimitives::MinimumBitWidth<duckdb::uhugeint_t,false>
                      ((BitpackingPrimitives *)uVar5.lower,value);
    uVar5.upper = extraout_RDX_00;
    uVar5.lower = (this->min_max_diff).upper;
    bVar2 = BitpackingPrimitives::MinimumBitWidth<duckdb::uhugeint_t,false>
                      ((BitpackingPrimitives *)(this->min_max_diff).lower,uVar5);
    uVar4 = extraout_RDX_01;
    if ((width < bVar2) && (this->mode != FOR)) {
      SubtractFrameOfReference<duckdb::hugeint_t>(this,this->delta_buffer,this->minimum_delta);
      hugeint_t::operator_cast_to_uhugeint_t(&this->minimum_delta);
      this->total_size = this->total_size + 0x28;
      iVar3 = BitpackingPrimitives::GetRequiredSize(this->compression_buffer_idx,width);
      this->total_size = this->total_size + iVar3;
      return true;
    }
  }
  bVar1 = this->can_do_for == true;
  if (bVar1) {
    value_00.upper = uVar4;
    value_00.lower = (this->min_max_diff).upper;
    width_00 = BitpackingPrimitives::MinimumBitWidth<duckdb::uhugeint_t,false>
                         ((BitpackingPrimitives *)(this->min_max_diff).lower,value_00);
    SubtractFrameOfReference<duckdb::uhugeint_t>(this,this->compression_buffer,this->minimum);
    iVar3 = BitpackingPrimitives::GetRequiredSize(this->compression_buffer_idx,width_00);
    this->total_size = iVar3 + this->total_size + 0x18;
  }
  return bVar1;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}